

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O2

void __thiscall sf::priv::WindowImplX11::setTitle(WindowImplX11 *this,String *title)

{
  Window WVar1;
  Display *pDVar2;
  ConstIterator begin;
  ConstIterator end;
  Atom AVar3;
  Atom AVar4;
  string local_98;
  locale local_78 [8];
  locale local_70 [8];
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  utf8Title;
  string local_48;
  
  utf8Title._M_dataplus._M_p = (pointer)&utf8Title.field_2;
  utf8Title._M_string_length = 0;
  utf8Title.field_2._M_local_buf[0] = '\0';
  begin = String::begin_abi_cxx11_(title);
  end = String::end_abi_cxx11_(title);
  Utf<32u>::
  toUtf8<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::__cxx11::basic_string<unsigned_int,std::char_traits<unsigned_int>,std::allocator<unsigned_int>>>,std::back_insert_iterator<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>>
            ((__normal_iterator<const_unsigned_int_*,_std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
              )begin._M_current,
             (__normal_iterator<const_unsigned_int_*,_std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
              )end._M_current,&utf8Title);
  std::__cxx11::string::string((string *)&local_98,"UTF8_STRING",(allocator *)&local_48);
  AVar3 = getAtom(&local_98,false);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"_NET_WM_NAME",(allocator *)&local_48);
  AVar4 = getAtom(&local_98,false);
  std::__cxx11::string::~string((string *)&local_98);
  XChangeProperty(this->m_display,this->m_window,AVar4,AVar3,8,0,utf8Title._M_dataplus._M_p,
                  utf8Title._M_string_length & 0xffffffff);
  std::__cxx11::string::string((string *)&local_98,"_NET_WM_ICON_NAME",(allocator *)&local_48);
  AVar4 = getAtom(&local_98,false);
  std::__cxx11::string::~string((string *)&local_98);
  XChangeProperty(this->m_display,this->m_window,AVar4,AVar3,8,0,utf8Title._M_dataplus._M_p,
                  utf8Title._M_string_length & 0xffffffff);
  WVar1 = this->m_window;
  pDVar2 = this->m_display;
  std::locale::locale(local_70);
  String::toAnsiString_abi_cxx11_(&local_98,title,local_70);
  std::locale::locale(local_78);
  String::toAnsiString_abi_cxx11_(&local_48,title,local_78);
  Xutf8SetWMProperties(pDVar2,WVar1,local_98._M_dataplus._M_p,local_48._M_dataplus._M_p,0,0,0,0,0);
  std::__cxx11::string::~string((string *)&local_48);
  std::locale::~locale(local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::locale::~locale(local_70);
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  ~basic_string(&utf8Title);
  return;
}

Assistant:

void WindowImplX11::setTitle(const String& title)
{
    // Bare X11 has no Unicode window title support.
    // There is however an option to tell the window manager your Unicode title via hints.

    // Convert to UTF-8 encoding.
    std::basic_string<Uint8> utf8Title;
    Utf32::toUtf8(title.begin(), title.end(), std::back_inserter(utf8Title));

    Atom useUtf8 = getAtom("UTF8_STRING", false);

    // Set the _NET_WM_NAME atom, which specifies a UTF-8 encoded window title.
    Atom wmName = getAtom("_NET_WM_NAME", false);
    XChangeProperty(m_display, m_window, wmName, useUtf8, 8,
                    PropModeReplace, utf8Title.c_str(), static_cast<int>(utf8Title.size()));

    // Set the _NET_WM_ICON_NAME atom, which specifies a UTF-8 encoded window title.
    Atom wmIconName = getAtom("_NET_WM_ICON_NAME", false);
    XChangeProperty(m_display, m_window, wmIconName, useUtf8, 8,
                    PropModeReplace, utf8Title.c_str(), static_cast<int>(utf8Title.size()));

    // Set the non-Unicode title as a fallback for window managers who don't support _NET_WM_NAME.
    #ifdef X_HAVE_UTF8_STRING
    Xutf8SetWMProperties(m_display,
                         m_window,
                         title.toAnsiString().c_str(),
                         title.toAnsiString().c_str(),
                         NULL,
                         0,
                         NULL,
                         NULL,
                         NULL);
    #else
    XmbSetWMProperties(m_display,
                       m_window,
                       title.toAnsiString().c_str(),
                       title.toAnsiString().c_str(),
                       NULL,
                       0,
                       NULL,
                       NULL,
                       NULL);
    #endif
}